

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O1

void aom_highbd_lpf_vertical_6_sse2
               (uint16_t *s,int p,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  uint16_t *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  uint16_t uVar32;
  uint16_t uVar33;
  uint16_t uVar34;
  uint16_t uVar35;
  uint16_t uVar36;
  uint16_t uVar37;
  uint16_t uVar38;
  uint16_t uVar39;
  uint16_t uVar40;
  uint16_t uVar41;
  uint16_t uVar42;
  uint16_t uVar43;
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined8 uVar55;
  undefined1 auVar56 [16];
  short sVar57;
  short sVar63;
  short sVar64;
  undefined8 uVar59;
  short sVar66;
  short sVar67;
  short sVar68;
  undefined1 auVar60 [16];
  short sVar58;
  undefined1 auVar61 [16];
  short sVar65;
  undefined1 auVar62 [16];
  short sVar69;
  short sVar74;
  short sVar75;
  short sVar76;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar77 [16];
  short sVar81;
  short sVar82;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  short sVar84;
  short sVar85;
  short sVar86;
  undefined1 auVar83 [16];
  short sVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  short sVar93;
  short sVar99;
  short sVar100;
  short sVar101;
  undefined1 auVar98 [16];
  ushort uVar102;
  ushort uVar109;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  ushort uVar116;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined4 uVar122;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  short sVar126;
  short sVar130;
  short sVar131;
  short sVar132;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  ushort uVar133;
  ushort uVar136;
  ushort uVar137;
  ushort uVar138;
  ushort uVar139;
  ushort uVar140;
  ushort uVar141;
  undefined1 auVar135 [16];
  ushort uVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  short sVar110;
  short sVar117;
  short sVar134;
  
  auVar72 = *(undefined1 (*) [16])(s + -3);
  puVar1 = s + (long)p + -3;
  uVar32 = *puVar1;
  uVar33 = puVar1[1];
  uVar34 = puVar1[2];
  uVar35 = puVar1[3];
  uVar36 = puVar1[4];
  uVar37 = puVar1[5];
  auVar104 = *(undefined1 (*) [16])(s + (long)(p * 2) + -3);
  puVar1 = s + (long)(p * 3) + -3;
  uVar38 = *puVar1;
  uVar39 = puVar1[1];
  uVar40 = puVar1[2];
  uVar41 = puVar1[3];
  uVar42 = puVar1[4];
  uVar43 = puVar1[5];
  sVar101 = auVar72._6_2_;
  auVar97._0_12_ = auVar72._0_12_;
  auVar97._12_2_ = sVar101;
  auVar97._14_2_ = uVar35;
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._0_10_ = auVar72._0_10_;
  auVar96._10_2_ = uVar34;
  sVar100 = auVar72._4_2_;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._0_8_ = auVar72._0_8_;
  auVar95._8_2_ = sVar100;
  auVar44._4_8_ = auVar95._8_8_;
  auVar44._2_2_ = uVar33;
  sVar99 = auVar72._2_2_;
  auVar44._0_2_ = sVar99;
  sVar93 = auVar72._0_2_;
  auVar94._0_4_ = CONCAT22(uVar32,sVar93);
  auVar94._4_12_ = auVar44;
  sVar76 = auVar104._6_2_;
  auVar71._0_12_ = auVar104._0_12_;
  auVar71._12_2_ = sVar76;
  auVar71._14_2_ = uVar41;
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._0_10_ = auVar104._0_10_;
  auVar70._10_2_ = uVar40;
  sVar75 = auVar104._4_2_;
  auVar88._10_6_ = auVar70._10_6_;
  auVar88._0_8_ = auVar104._0_8_;
  auVar88._8_2_ = sVar75;
  auVar45._4_8_ = auVar88._8_8_;
  auVar45._2_2_ = uVar39;
  sVar74 = auVar104._2_2_;
  auVar45._0_2_ = sVar74;
  sVar69 = auVar104._0_2_;
  auVar119._0_8_ = auVar94._0_8_;
  auVar119._8_4_ = auVar44._0_4_;
  auVar119._12_4_ = auVar45._0_4_;
  auVar92._8_8_ = auVar119._8_8_;
  uVar55 = CONCAT44(CONCAT22(uVar38,sVar69),auVar94._0_4_);
  auVar98._0_8_ = CONCAT44(auVar88._8_4_,auVar95._8_4_);
  auVar98._8_4_ = auVar96._12_4_;
  auVar98._12_4_ = auVar70._12_4_;
  auVar135._4_4_ = auVar45._0_4_;
  auVar135._0_4_ = auVar44._0_4_;
  sVar66 = auVar72._8_2_;
  sVar67 = auVar72._10_2_;
  auVar144._0_8_ = CONCAT26(uVar37,CONCAT24(sVar67,CONCAT22(uVar36,sVar66)));
  sVar81 = auVar104._8_2_;
  sVar82 = auVar104._10_2_;
  auVar144._8_4_ = (int)((ulong)auVar144._0_8_ >> 0x20);
  auVar144._12_4_ = (int)(CONCAT26(uVar43,CONCAT24(sVar82,CONCAT22(uVar42,sVar81))) >> 0x20);
  uVar59 = CONCAT44(CONCAT22(uVar42,sVar81),CONCAT22(uVar36,sVar66));
  auVar135._8_8_ = uVar59;
  auVar72 = *(undefined1 (*) [16])limit;
  auVar11[0xd] = 0;
  auVar11._0_13_ = auVar72._0_13_;
  auVar11[0xe] = auVar72[7];
  auVar14[0xc] = auVar72[6];
  auVar14._0_12_ = auVar72._0_12_;
  auVar14._13_2_ = auVar11._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar72._0_11_;
  auVar17._12_3_ = auVar14._12_3_;
  auVar20[10] = auVar72[5];
  auVar20._0_10_ = auVar72._0_10_;
  auVar20._11_4_ = auVar17._11_4_;
  auVar23[9] = 0;
  auVar23._0_9_ = auVar72._0_9_;
  auVar23._10_5_ = auVar20._10_5_;
  auVar26[8] = auVar72[4];
  auVar26._0_8_ = auVar72._0_8_;
  auVar26._9_6_ = auVar23._9_6_;
  auVar46._7_8_ = 0;
  auVar46._0_7_ = auVar26._8_7_;
  auVar49._1_8_ = SUB158(auVar46 << 0x40,7);
  auVar49[0] = auVar72[3];
  auVar49._9_6_ = 0;
  auVar50._1_10_ = SUB1510(auVar49 << 0x30,5);
  auVar50[0] = auVar72[2];
  auVar50._11_4_ = 0;
  auVar29[2] = auVar72[1];
  auVar29._0_2_ = auVar72._0_2_;
  auVar29._3_12_ = SUB1512(auVar50 << 0x20,3);
  auVar103._0_2_ = auVar72._0_2_ & 0xff;
  auVar103._2_13_ = auVar29._2_13_;
  auVar103[0xf] = 0;
  auVar88 = ZEXT416(bd - 8);
  auVar104 = psllw(auVar103,auVar88);
  auVar72 = *(undefined1 (*) [16])thresh;
  auVar12[0xd] = 0;
  auVar12._0_13_ = auVar72._0_13_;
  auVar12[0xe] = auVar72[7];
  auVar15[0xc] = auVar72[6];
  auVar15._0_12_ = auVar72._0_12_;
  auVar15._13_2_ = auVar12._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar72._0_11_;
  auVar18._12_3_ = auVar15._12_3_;
  auVar21[10] = auVar72[5];
  auVar21._0_10_ = auVar72._0_10_;
  auVar21._11_4_ = auVar18._11_4_;
  auVar24[9] = 0;
  auVar24._0_9_ = auVar72._0_9_;
  auVar24._10_5_ = auVar21._10_5_;
  auVar27[8] = auVar72[4];
  auVar27._0_8_ = auVar72._0_8_;
  auVar27._9_6_ = auVar24._9_6_;
  auVar47._7_8_ = 0;
  auVar47._0_7_ = auVar27._8_7_;
  auVar51._1_8_ = SUB158(auVar47 << 0x40,7);
  auVar51[0] = auVar72[3];
  auVar51._9_6_ = 0;
  auVar52._1_10_ = SUB1510(auVar51 << 0x30,5);
  auVar52[0] = auVar72[2];
  auVar52._11_4_ = 0;
  auVar30[2] = auVar72[1];
  auVar30._0_2_ = auVar72._0_2_;
  auVar30._3_12_ = SUB1512(auVar52 << 0x20,3);
  auVar118._0_2_ = auVar72._0_2_ & 0xff;
  auVar118._2_13_ = auVar30._2_13_;
  auVar118[0xf] = 0;
  auVar119 = psllw(auVar118,auVar88);
  auVar77._8_8_ = auVar144._8_8_;
  auVar77._0_8_ = uVar55;
  auVar92._0_8_ = auVar98._0_8_;
  auVar78._8_8_ = uVar59;
  auVar78._0_8_ = auVar98._8_8_;
  auVar123 = psubusw(auVar98,auVar135);
  auVar72 = psubusw(auVar135,auVar98);
  auVar72 = auVar72 | auVar123;
  sVar84 = auVar72._0_2_;
  sVar126 = auVar72._8_2_;
  auVar145._0_2_ = (ushort)(sVar126 < sVar84) * sVar84 | (ushort)(sVar126 >= sVar84) * sVar126;
  sVar85 = auVar72._2_2_;
  sVar130 = auVar72._10_2_;
  auVar145._2_2_ = (ushort)(sVar130 < sVar85) * sVar85 | (ushort)(sVar130 >= sVar85) * sVar130;
  sVar86 = auVar72._4_2_;
  sVar131 = auVar72._12_2_;
  auVar145._4_2_ = (ushort)(sVar131 < sVar86) * sVar86 | (ushort)(sVar131 >= sVar86) * sVar131;
  sVar87 = auVar72._6_2_;
  sVar132 = auVar72._14_2_;
  auVar145._6_2_ = (ushort)(sVar132 < sVar87) * sVar87 | (ushort)(sVar132 >= sVar87) * sVar132;
  sVar63 = (ushort)(0 < sVar126) * sVar126;
  auVar145._8_2_ = sVar63;
  sVar58 = (ushort)(0 < sVar130) * sVar130;
  auVar145._10_2_ = sVar58;
  sVar65 = (ushort)(0 < sVar131) * sVar131;
  auVar145._12_2_ = sVar65;
  sVar64 = (ushort)(0 < sVar132) * sVar132;
  auVar145._14_2_ = sVar64;
  auVar143._8_8_ = auVar144._8_8_;
  auVar143._0_8_ = uVar55;
  auVar144 = psubusw(auVar143,auVar135);
  auVar72 = psubusw(auVar135,auVar77);
  auVar72 = auVar72 | auVar144;
  sVar134 = auVar72._0_2_;
  uVar133 = (sVar134 < (short)auVar145._0_2_) * auVar145._0_2_ |
            (ushort)(sVar134 >= (short)auVar145._0_2_) * sVar134;
  sVar134 = auVar72._2_2_;
  uVar136 = (sVar134 < (short)auVar145._2_2_) * auVar145._2_2_ |
            (ushort)(sVar134 >= (short)auVar145._2_2_) * sVar134;
  sVar134 = auVar72._4_2_;
  uVar137 = (sVar134 < (short)auVar145._4_2_) * auVar145._4_2_ |
            (ushort)(sVar134 >= (short)auVar145._4_2_) * sVar134;
  sVar134 = auVar72._6_2_;
  uVar138 = (sVar134 < (short)auVar145._6_2_) * auVar145._6_2_ |
            (ushort)(sVar134 >= (short)auVar145._6_2_) * sVar134;
  sVar134 = auVar72._8_2_;
  uVar139 = (ushort)(sVar134 < sVar63) * sVar63 | (ushort)(sVar134 >= sVar63) * sVar134;
  sVar63 = auVar72._10_2_;
  uVar140 = (ushort)(sVar63 < sVar58) * sVar58 | (ushort)(sVar63 >= sVar58) * sVar63;
  sVar58 = auVar72._12_2_;
  sVar63 = auVar72._14_2_;
  uVar141 = (ushort)(sVar58 < sVar65) * sVar65 | (ushort)(sVar58 >= sVar65) * sVar58;
  uVar142 = (ushort)(sVar63 < sVar64) * sVar64 | (ushort)(sVar63 >= sVar64) * sVar63;
  auVar145 = auVar145 ^ _DAT_004dab60;
  auVar119 = auVar119 ^ _DAT_004dab60;
  auVar146._0_4_ =
       CONCAT22(-(ushort)(auVar119._2_2_ < auVar145._2_2_),
                -(ushort)(auVar119._0_2_ < auVar145._0_2_));
  auVar120._8_8_ = auVar92._8_8_;
  auVar120._0_8_ = auVar98._0_8_;
  auVar72 = psubusw(auVar120,auVar78);
  auVar144 = psubusw(auVar78,auVar92);
  auVar144 = auVar144 | auVar72;
  auVar72 = paddusw(auVar144,auVar144);
  auVar121._0_8_ = auVar72._0_8_;
  auVar121._8_8_ = 0;
  auVar127._0_2_ = auVar144._8_2_ >> 1;
  auVar127._2_2_ = auVar144._10_2_ >> 1;
  auVar127._4_2_ = auVar144._12_2_ >> 1;
  auVar127._6_2_ = auVar144._14_2_ >> 1;
  auVar127._8_8_ = 0;
  auVar144 = paddusw(auVar127,auVar121);
  auVar72 = *(undefined1 (*) [16])blimit;
  auVar13[0xd] = 0;
  auVar13._0_13_ = auVar72._0_13_;
  auVar13[0xe] = auVar72[7];
  auVar16[0xc] = auVar72[6];
  auVar16._0_12_ = auVar72._0_12_;
  auVar16._13_2_ = auVar13._13_2_;
  auVar19[0xb] = 0;
  auVar19._0_11_ = auVar72._0_11_;
  auVar19._12_3_ = auVar16._12_3_;
  auVar22[10] = auVar72[5];
  auVar22._0_10_ = auVar72._0_10_;
  auVar22._11_4_ = auVar19._11_4_;
  auVar25[9] = 0;
  auVar25._0_9_ = auVar72._0_9_;
  auVar25._10_5_ = auVar22._10_5_;
  auVar28[8] = auVar72[4];
  auVar28._0_8_ = auVar72._0_8_;
  auVar28._9_6_ = auVar25._9_6_;
  auVar48._7_8_ = 0;
  auVar48._0_7_ = auVar28._8_7_;
  auVar53._1_8_ = SUB158(auVar48 << 0x40,7);
  auVar53[0] = auVar72[3];
  auVar53._9_6_ = 0;
  auVar54._1_10_ = SUB1510(auVar53 << 0x30,5);
  auVar54[0] = auVar72[2];
  auVar54._11_4_ = 0;
  auVar31[2] = auVar72[1];
  auVar31._0_2_ = auVar72._0_2_;
  auVar31._3_12_ = SUB1512(auVar54 << 0x20,3);
  auVar147._0_2_ = auVar72._0_2_ & 0xff;
  auVar147._2_13_ = auVar31._2_13_;
  auVar147[0xf] = 0;
  auVar72 = psllw(auVar147,auVar88);
  auVar144 = auVar144 ^ _DAT_004dab60;
  auVar72 = auVar72 ^ _DAT_004dab60;
  auVar128._0_2_ = -(ushort)(auVar72._0_2_ < auVar144._0_2_);
  auVar128._2_2_ = -(ushort)(auVar72._2_2_ < auVar144._2_2_);
  auVar128._4_2_ = -(ushort)(auVar72._4_2_ < auVar144._4_2_);
  auVar128._6_2_ = -(ushort)(auVar72._6_2_ < auVar144._6_2_);
  auVar128._8_2_ = -(ushort)(auVar72._8_2_ < auVar144._8_2_);
  auVar128._10_2_ = -(ushort)(auVar72._10_2_ < auVar144._10_2_);
  auVar128._12_2_ = -(ushort)(auVar72._12_2_ < auVar144._12_2_);
  auVar128._14_2_ = -(ushort)(auVar72._14_2_ < auVar144._14_2_);
  auVar72 = paddusw(auVar104,_DAT_005154e0);
  auVar72 = auVar72 & auVar128;
  sVar58 = auVar72._0_2_;
  uVar133 = (ushort)((short)uVar133 < sVar58) * sVar58 | ((short)uVar133 >= sVar58) * uVar133;
  sVar58 = auVar72._2_2_;
  uVar136 = (ushort)((short)uVar136 < sVar58) * sVar58 | ((short)uVar136 >= sVar58) * uVar136;
  sVar58 = auVar72._4_2_;
  uVar137 = (ushort)((short)uVar137 < sVar58) * sVar58 | ((short)uVar137 >= sVar58) * uVar137;
  sVar58 = auVar72._6_2_;
  uVar138 = (ushort)((short)uVar138 < sVar58) * sVar58 | ((short)uVar138 >= sVar58) * uVar138;
  sVar58 = auVar72._8_2_;
  uVar139 = (ushort)((short)uVar139 < sVar58) * sVar58 | ((short)uVar139 >= sVar58) * uVar139;
  sVar58 = auVar72._10_2_;
  uVar140 = (ushort)((short)uVar140 < sVar58) * sVar58 | ((short)uVar140 >= sVar58) * uVar140;
  sVar58 = auVar72._12_2_;
  uVar141 = (ushort)((short)uVar141 < sVar58) * sVar58 | ((short)uVar141 >= sVar58) * uVar141;
  sVar58 = auVar72._14_2_;
  uVar142 = (ushort)((short)uVar142 < sVar58) * sVar58 | ((short)uVar142 >= sVar58) * uVar142;
  auVar72 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar72 = pshuflw(auVar72,auVar72,0);
  uVar122 = auVar72._0_4_;
  auVar129._4_4_ = uVar122;
  auVar129._0_4_ = uVar122;
  auVar129._8_4_ = uVar122;
  auVar129._12_4_ = uVar122;
  auVar146._4_4_ =
       (undefined4)
       (CONCAT26(-(ushort)(auVar119._6_2_ < auVar145._6_2_),
                 CONCAT24(-(ushort)(auVar119._4_2_ < auVar145._4_2_),auVar146._0_4_)) >> 0x20);
  auVar146._8_4_ = auVar146._0_4_;
  auVar146._12_4_ = auVar146._4_4_;
  auVar124._0_2_ =
       ((short)uVar139 < (short)uVar133) * uVar133 | ((short)uVar139 >= (short)uVar133) * uVar139;
  auVar124._2_2_ =
       ((short)uVar140 < (short)uVar136) * uVar136 | ((short)uVar140 >= (short)uVar136) * uVar140;
  auVar124._4_2_ =
       ((short)uVar141 < (short)uVar137) * uVar137 | ((short)uVar141 >= (short)uVar137) * uVar141;
  auVar124._6_2_ =
       ((short)uVar142 < (short)uVar138) * uVar138 | ((short)uVar142 >= (short)uVar138) * uVar142;
  auVar124._8_2_ = (0 < (short)uVar139) * uVar139;
  auVar124._10_2_ = (0 < (short)uVar140) * uVar140;
  auVar124._12_2_ = (0 < (short)uVar141) * uVar141;
  auVar124._14_2_ = (0 < (short)uVar142) * uVar142;
  auVar144 = psubusw(auVar124,auVar104);
  auVar72 = psllw(_DAT_005154e0,ZEXT416((uint)bd));
  auVar105._8_4_ = 0xffffffff;
  auVar105._0_8_ = 0xffffffffffffffff;
  auVar105._12_4_ = 0xffffffff;
  auVar72 = paddsw(auVar72,auVar105);
  auVar123 = psubsw(auVar72,auVar129);
  auVar148 = psubsw((undefined1  [16])0x0,auVar129);
  auVar72 = psubsw(auVar92,auVar129);
  auVar119 = psubsw(auVar78,auVar129);
  auVar104 = psubsw(auVar72,auVar119);
  sVar110 = auVar123._0_2_;
  sVar58 = auVar104._0_2_;
  uVar133 = (ushort)(sVar110 < sVar58) * sVar110 | (ushort)(sVar110 >= sVar58) * sVar58;
  sVar117 = auVar123._2_2_;
  sVar58 = auVar104._2_2_;
  uVar136 = (ushort)(sVar117 < sVar58) * sVar117 | (ushort)(sVar117 >= sVar58) * sVar58;
  sVar5 = auVar123._4_2_;
  sVar58 = auVar104._4_2_;
  uVar137 = (ushort)(sVar5 < sVar58) * sVar5 | (ushort)(sVar5 >= sVar58) * sVar58;
  sVar6 = auVar123._6_2_;
  sVar58 = auVar104._6_2_;
  uVar138 = (ushort)(sVar6 < sVar58) * sVar6 | (ushort)(sVar6 >= sVar58) * sVar58;
  sVar7 = auVar123._8_2_;
  sVar58 = auVar104._8_2_;
  uVar139 = (ushort)(sVar7 < sVar58) * sVar7 | (ushort)(sVar7 >= sVar58) * sVar58;
  sVar8 = auVar123._10_2_;
  sVar58 = auVar104._10_2_;
  uVar140 = (ushort)(sVar8 < sVar58) * sVar8 | (ushort)(sVar8 >= sVar58) * sVar58;
  sVar9 = auVar123._12_2_;
  sVar58 = auVar104._12_2_;
  sVar63 = auVar104._14_2_;
  uVar141 = (ushort)(sVar9 < sVar58) * sVar9 | (ushort)(sVar9 >= sVar58) * sVar58;
  sVar10 = auVar123._14_2_;
  uVar142 = (ushort)(sVar10 < sVar63) * sVar10 | (ushort)(sVar10 >= sVar63) * sVar63;
  sVar58 = auVar148._0_2_;
  auVar123._0_2_ = (ushort)((short)uVar133 < sVar58) * sVar58 | ((short)uVar133 >= sVar58) * uVar133
  ;
  sVar63 = auVar148._2_2_;
  auVar123._2_2_ = (ushort)((short)uVar136 < sVar63) * sVar63 | ((short)uVar136 >= sVar63) * uVar136
  ;
  sVar64 = auVar148._4_2_;
  auVar123._4_2_ = (ushort)((short)uVar137 < sVar64) * sVar64 | ((short)uVar137 >= sVar64) * uVar137
  ;
  sVar65 = auVar148._6_2_;
  auVar123._6_2_ = (ushort)((short)uVar138 < sVar65) * sVar65 | ((short)uVar138 >= sVar65) * uVar138
  ;
  sVar134 = auVar148._8_2_;
  auVar123._8_2_ =
       (ushort)((short)uVar139 < sVar134) * sVar134 | ((short)uVar139 >= sVar134) * uVar139;
  sVar2 = auVar148._10_2_;
  auVar123._10_2_ = (ushort)((short)uVar140 < sVar2) * sVar2 | ((short)uVar140 >= sVar2) * uVar140;
  sVar3 = auVar148._12_2_;
  auVar123._12_2_ = (ushort)((short)uVar141 < sVar3) * sVar3 | ((short)uVar141 >= sVar3) * uVar141;
  sVar4 = auVar148._14_2_;
  auVar123._14_2_ = (ushort)((short)uVar142 < sVar4) * sVar4 | ((short)uVar142 >= sVar4) * uVar142;
  auVar104 = psubsw(auVar123 >> 0x40 & auVar146,auVar123);
  auVar104 = psubsw(auVar104,auVar123);
  auVar104 = psubsw(auVar104,auVar123);
  auVar125._0_2_ = -(ushort)(auVar144._0_2_ == 0);
  auVar125._2_2_ = -(ushort)(auVar144._2_2_ == 0);
  auVar125._4_2_ = -(ushort)(auVar144._4_2_ == 0);
  auVar125._6_2_ = -(ushort)(auVar144._6_2_ == 0);
  auVar125._8_2_ = -(ushort)(auVar144._8_2_ == 0);
  auVar125._10_2_ = -(ushort)(auVar144._10_2_ == 0);
  auVar125._12_2_ = -(ushort)(auVar144._12_2_ == 0);
  auVar125._14_2_ = -(ushort)(auVar144._14_2_ == 0);
  sVar57 = auVar104._0_2_;
  uVar133 = (ushort)(sVar110 < sVar57) * sVar110 | (ushort)(sVar110 >= sVar57) * sVar57;
  sVar57 = auVar104._2_2_;
  uVar136 = (ushort)(sVar117 < sVar57) * sVar117 | (ushort)(sVar117 >= sVar57) * sVar57;
  sVar57 = auVar104._4_2_;
  uVar137 = (ushort)(sVar5 < sVar57) * sVar5 | (ushort)(sVar5 >= sVar57) * sVar57;
  sVar57 = auVar104._6_2_;
  uVar138 = (ushort)(sVar6 < sVar57) * sVar6 | (ushort)(sVar6 >= sVar57) * sVar57;
  sVar57 = auVar104._8_2_;
  uVar139 = (ushort)(sVar7 < sVar57) * sVar7 | (ushort)(sVar7 >= sVar57) * sVar57;
  sVar57 = auVar104._10_2_;
  uVar140 = (ushort)(sVar8 < sVar57) * sVar8 | (ushort)(sVar8 >= sVar57) * sVar57;
  sVar57 = auVar104._12_2_;
  sVar68 = auVar104._14_2_;
  uVar141 = (ushort)(sVar9 < sVar57) * sVar9 | (ushort)(sVar9 >= sVar57) * sVar57;
  uVar142 = (ushort)(sVar10 < sVar68) * sVar10 | (ushort)(sVar10 >= sVar68) * sVar68;
  auVar90._0_2_ = (ushort)((short)uVar133 < sVar58) * sVar58 | ((short)uVar133 >= sVar58) * uVar133;
  auVar90._2_2_ = (ushort)((short)uVar136 < sVar63) * sVar63 | ((short)uVar136 >= sVar63) * uVar136;
  auVar90._4_2_ = (ushort)((short)uVar137 < sVar64) * sVar64 | ((short)uVar137 >= sVar64) * uVar137;
  auVar90._6_2_ = (ushort)((short)uVar138 < sVar65) * sVar65 | ((short)uVar138 >= sVar65) * uVar138;
  auVar90._8_2_ =
       (ushort)((short)uVar139 < sVar134) * sVar134 | ((short)uVar139 >= sVar134) * uVar139;
  auVar90._10_2_ = (ushort)((short)uVar140 < sVar2) * sVar2 | ((short)uVar140 >= sVar2) * uVar140;
  auVar90._12_2_ = (ushort)((short)uVar141 < sVar3) * sVar3 | ((short)uVar141 >= sVar3) * uVar141;
  auVar90._14_2_ = (ushort)((short)uVar142 < sVar4) * sVar4 | ((short)uVar142 >= sVar4) * uVar142;
  auVar90 = auVar90 & auVar125;
  auVar148._0_8_ = auVar90._0_8_;
  auVar148._8_4_ = auVar90._0_4_;
  auVar148._12_4_ = auVar90._4_4_;
  auVar104 = paddsw(auVar148,_DAT_005154f0);
  sVar57 = auVar104._0_2_;
  uVar133 = (ushort)(sVar110 < sVar57) * sVar110 | (ushort)(sVar110 >= sVar57) * sVar57;
  sVar57 = auVar104._2_2_;
  uVar136 = (ushort)(sVar117 < sVar57) * sVar117 | (ushort)(sVar117 >= sVar57) * sVar57;
  sVar57 = auVar104._4_2_;
  uVar137 = (ushort)(sVar5 < sVar57) * sVar5 | (ushort)(sVar5 >= sVar57) * sVar57;
  sVar57 = auVar104._6_2_;
  uVar138 = (ushort)(sVar6 < sVar57) * sVar6 | (ushort)(sVar6 >= sVar57) * sVar57;
  sVar57 = auVar104._8_2_;
  uVar139 = (ushort)(sVar7 < sVar57) * sVar7 | (ushort)(sVar7 >= sVar57) * sVar57;
  sVar57 = auVar104._10_2_;
  uVar140 = (ushort)(sVar8 < sVar57) * sVar8 | (ushort)(sVar8 >= sVar57) * sVar57;
  sVar57 = auVar104._12_2_;
  sVar68 = auVar104._14_2_;
  uVar141 = (ushort)(sVar9 < sVar57) * sVar9 | (ushort)(sVar9 >= sVar57) * sVar57;
  uVar142 = (ushort)(sVar10 < sVar68) * sVar10 | (ushort)(sVar10 >= sVar68) * sVar68;
  auVar60._0_2_ = (ushort)((short)uVar133 < sVar58) * sVar58 | ((short)uVar133 >= sVar58) * uVar133;
  auVar60._2_2_ = (ushort)((short)uVar136 < sVar63) * sVar63 | ((short)uVar136 >= sVar63) * uVar136;
  auVar60._4_2_ = (ushort)((short)uVar137 < sVar64) * sVar64 | ((short)uVar137 >= sVar64) * uVar137;
  auVar60._6_2_ = (ushort)((short)uVar138 < sVar65) * sVar65 | ((short)uVar138 >= sVar65) * uVar138;
  auVar60._8_2_ =
       (ushort)((short)uVar139 < sVar134) * sVar134 | ((short)uVar139 >= sVar134) * uVar139;
  auVar60._10_2_ = (ushort)((short)uVar140 < sVar2) * sVar2 | ((short)uVar140 >= sVar2) * uVar140;
  auVar60._12_2_ = (ushort)((short)uVar141 < sVar3) * sVar3 | ((short)uVar141 >= sVar3) * uVar141;
  auVar60._14_2_ = (ushort)((short)uVar142 < sVar4) * sVar4 | ((short)uVar142 >= sVar4) * uVar142;
  auVar104 = psraw(auVar60,3);
  auVar91._0_2_ = auVar104._0_2_ + 1;
  auVar91._2_2_ = auVar104._2_2_ + 1;
  auVar91._4_2_ = auVar104._4_2_ + 1;
  auVar91._6_2_ = auVar104._6_2_ + 1;
  auVar91._8_2_ = auVar104._0_2_ + 1;
  auVar91._10_2_ = auVar104._2_2_ + 1;
  auVar91._12_2_ = auVar104._4_2_ + 1;
  auVar91._14_2_ = auVar104._6_2_ + 1;
  auVar92 = psraw(auVar91,1);
  auVar106._8_8_ = SUB168(~auVar146 & auVar92,8);
  auVar106._0_8_ = auVar104._8_8_;
  auVar61._8_8_ = SUB168(~auVar146 & auVar92,0);
  auVar61._0_8_ = auVar104._0_8_;
  auVar104 = psubsw(auVar119,auVar61);
  auVar72 = paddsw(auVar106,auVar72);
  sVar57 = auVar104._0_2_;
  uVar133 = (ushort)(sVar110 < sVar57) * sVar110 | (ushort)(sVar110 >= sVar57) * sVar57;
  sVar57 = auVar104._2_2_;
  uVar136 = (ushort)(sVar117 < sVar57) * sVar117 | (ushort)(sVar117 >= sVar57) * sVar57;
  sVar57 = auVar104._4_2_;
  uVar137 = (ushort)(sVar5 < sVar57) * sVar5 | (ushort)(sVar5 >= sVar57) * sVar57;
  sVar57 = auVar104._6_2_;
  uVar138 = (ushort)(sVar6 < sVar57) * sVar6 | (ushort)(sVar6 >= sVar57) * sVar57;
  sVar57 = auVar104._8_2_;
  uVar139 = (ushort)(sVar7 < sVar57) * sVar7 | (ushort)(sVar7 >= sVar57) * sVar57;
  sVar57 = auVar104._10_2_;
  uVar140 = (ushort)(sVar8 < sVar57) * sVar8 | (ushort)(sVar8 >= sVar57) * sVar57;
  sVar57 = auVar104._12_2_;
  sVar68 = auVar104._14_2_;
  uVar141 = (ushort)(sVar9 < sVar57) * sVar9 | (ushort)(sVar9 >= sVar57) * sVar57;
  uVar142 = (ushort)(sVar10 < sVar68) * sVar10 | (ushort)(sVar10 >= sVar68) * sVar68;
  sVar57 = auVar72._0_2_;
  uVar102 = (ushort)(sVar110 < sVar57) * sVar110 | (ushort)(sVar110 >= sVar57) * sVar57;
  sVar110 = auVar72._2_2_;
  uVar109 = (ushort)(sVar117 < sVar110) * sVar117 | (ushort)(sVar117 >= sVar110) * sVar110;
  sVar110 = auVar72._4_2_;
  uVar111 = (ushort)(sVar5 < sVar110) * sVar5 | (ushort)(sVar5 >= sVar110) * sVar110;
  sVar110 = auVar72._6_2_;
  uVar112 = (ushort)(sVar6 < sVar110) * sVar6 | (ushort)(sVar6 >= sVar110) * sVar110;
  sVar110 = auVar72._8_2_;
  uVar113 = (ushort)(sVar7 < sVar110) * sVar7 | (ushort)(sVar7 >= sVar110) * sVar110;
  sVar110 = auVar72._10_2_;
  uVar114 = (ushort)(sVar8 < sVar110) * sVar8 | (ushort)(sVar8 >= sVar110) * sVar110;
  sVar110 = auVar72._12_2_;
  sVar117 = auVar72._14_2_;
  uVar115 = (ushort)(sVar9 < sVar110) * sVar9 | (ushort)(sVar9 >= sVar110) * sVar110;
  uVar116 = (ushort)(sVar10 < sVar117) * sVar10 | (ushort)(sVar10 >= sVar117) * sVar117;
  auVar79._0_2_ = (ushort)((short)uVar133 < sVar58) * sVar58 | ((short)uVar133 >= sVar58) * uVar133;
  auVar79._2_2_ = (ushort)((short)uVar136 < sVar63) * sVar63 | ((short)uVar136 >= sVar63) * uVar136;
  auVar79._4_2_ = (ushort)((short)uVar137 < sVar64) * sVar64 | ((short)uVar137 >= sVar64) * uVar137;
  auVar79._6_2_ = (ushort)((short)uVar138 < sVar65) * sVar65 | ((short)uVar138 >= sVar65) * uVar138;
  auVar79._8_2_ =
       (ushort)((short)uVar139 < sVar134) * sVar134 | ((short)uVar139 >= sVar134) * uVar139;
  auVar79._10_2_ = (ushort)((short)uVar140 < sVar2) * sVar2 | ((short)uVar140 >= sVar2) * uVar140;
  auVar79._12_2_ = (ushort)((short)uVar141 < sVar3) * sVar3 | ((short)uVar141 >= sVar3) * uVar141;
  auVar79._14_2_ = (ushort)((short)uVar142 < sVar4) * sVar4 | ((short)uVar142 >= sVar4) * uVar142;
  auVar107._0_2_ = (ushort)((short)uVar102 < sVar58) * sVar58 | ((short)uVar102 >= sVar58) * uVar102
  ;
  auVar107._2_2_ = (ushort)((short)uVar109 < sVar63) * sVar63 | ((short)uVar109 >= sVar63) * uVar109
  ;
  auVar107._4_2_ = (ushort)((short)uVar111 < sVar64) * sVar64 | ((short)uVar111 >= sVar64) * uVar111
  ;
  auVar107._6_2_ = (ushort)((short)uVar112 < sVar65) * sVar65 | ((short)uVar112 >= sVar65) * uVar112
  ;
  auVar107._8_2_ =
       (ushort)((short)uVar113 < sVar134) * sVar134 | ((short)uVar113 >= sVar134) * uVar113;
  auVar107._10_2_ = (ushort)((short)uVar114 < sVar2) * sVar2 | ((short)uVar114 >= sVar2) * uVar114;
  auVar107._12_2_ = (ushort)((short)uVar115 < sVar3) * sVar3 | ((short)uVar115 >= sVar3) * uVar115;
  auVar107._14_2_ = (ushort)((short)uVar116 < sVar4) * sVar4 | ((short)uVar116 >= sVar4) * uVar116;
  auVar119 = paddsw(auVar79,auVar129);
  auVar92 = paddsw(auVar107,auVar129);
  auVar72 = psubusw(auVar77,auVar98);
  auVar104 = psubusw(auVar98,auVar77);
  auVar104 = auVar104 | auVar72;
  sVar58 = auVar104._0_2_;
  auVar62._0_2_ = (ushort)(sVar58 < sVar84) * sVar84 | (ushort)(sVar58 >= sVar84) * sVar58;
  sVar58 = auVar104._2_2_;
  auVar62._2_2_ = (ushort)(sVar58 < sVar85) * sVar85 | (ushort)(sVar58 >= sVar85) * sVar58;
  sVar58 = auVar104._4_2_;
  auVar62._4_2_ = (ushort)(sVar58 < sVar86) * sVar86 | (ushort)(sVar58 >= sVar86) * sVar58;
  sVar58 = auVar104._6_2_;
  auVar62._6_2_ = (ushort)(sVar58 < sVar87) * sVar87 | (ushort)(sVar58 >= sVar87) * sVar58;
  sVar58 = auVar104._8_2_;
  auVar62._8_2_ = (ushort)(sVar58 < sVar126) * sVar126 | (ushort)(sVar58 >= sVar126) * sVar58;
  sVar58 = auVar104._10_2_;
  auVar62._10_2_ = (ushort)(sVar58 < sVar130) * sVar130 | (ushort)(sVar58 >= sVar130) * sVar58;
  sVar58 = auVar104._12_2_;
  sVar63 = auVar104._14_2_;
  auVar62._12_2_ = (ushort)(sVar58 < sVar131) * sVar131 | (ushort)(sVar58 >= sVar131) * sVar58;
  auVar62._14_2_ = (ushort)(sVar63 < sVar132) * sVar132 | (ushort)(sVar63 >= sVar132) * sVar63;
  auVar104 = psllw(_DAT_005154e0,auVar88);
  auVar72._0_2_ =
       ((short)auVar62._8_2_ < (short)auVar62._0_2_) * auVar62._0_2_ |
       ((short)auVar62._8_2_ >= (short)auVar62._0_2_) * auVar62._8_2_;
  auVar72._2_2_ =
       ((short)auVar62._10_2_ < (short)auVar62._2_2_) * auVar62._2_2_ |
       ((short)auVar62._10_2_ >= (short)auVar62._2_2_) * auVar62._10_2_;
  auVar72._4_2_ =
       ((short)auVar62._12_2_ < (short)auVar62._4_2_) * auVar62._4_2_ |
       ((short)auVar62._12_2_ >= (short)auVar62._4_2_) * auVar62._12_2_;
  auVar72._6_2_ =
       ((short)auVar62._14_2_ < (short)auVar62._6_2_) * auVar62._6_2_ |
       ((short)auVar62._14_2_ >= (short)auVar62._6_2_) * auVar62._14_2_;
  auVar72._8_2_ = (0 < (short)auVar62._8_2_) * auVar62._8_2_;
  auVar72._10_2_ = (0 < (short)auVar62._10_2_) * auVar62._10_2_;
  auVar72._12_2_ = (0 < (short)auVar62._12_2_) * auVar62._12_2_;
  auVar72._14_2_ = (0 < (short)auVar62._14_2_) * auVar62._14_2_;
  auVar72 = psubusw(auVar72,auVar104);
  auVar104._0_2_ = -(ushort)(auVar72._0_2_ == 0);
  auVar104._2_2_ = -(ushort)(auVar72._2_2_ == 0);
  auVar104._4_2_ = -(ushort)(auVar72._4_2_ == 0);
  auVar104._6_2_ = -(ushort)(auVar72._6_2_ == 0);
  auVar104._8_2_ = -(ushort)(auVar72._8_2_ == 0);
  auVar104._10_2_ = -(ushort)(auVar72._10_2_ == 0);
  auVar104._12_2_ = -(ushort)(auVar72._12_2_ == 0);
  auVar104._14_2_ = -(ushort)(auVar72._14_2_ == 0);
  auVar104 = auVar104 & auVar125;
  auVar89._0_8_ = auVar104._0_8_;
  auVar89._8_4_ = auVar104._0_4_;
  auVar89._12_4_ = auVar104._4_4_;
  auVar83._0_2_ = -(ushort)(auVar104._0_2_ == 0);
  auVar83._2_2_ = -(ushort)(auVar104._2_2_ == 0);
  auVar83._4_2_ = -(ushort)(auVar104._4_2_ == 0);
  auVar83._6_2_ = -(ushort)(auVar104._6_2_ == 0);
  auVar83._8_2_ = -(ushort)(auVar104._0_2_ == 0);
  auVar83._10_2_ = -(ushort)(auVar104._2_2_ == 0);
  auVar83._12_2_ = -(ushort)(auVar104._4_2_ == 0);
  auVar83._14_2_ = -(ushort)(auVar104._6_2_ == 0);
  if ((ushort)((ushort)(SUB161(auVar83 >> 7,0) & 1) | (ushort)(SUB161(auVar83 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar83 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar83 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar83 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar83 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar83 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar83 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar83 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar83 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar83 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar83 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar83 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar83 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar83._14_2_ >> 7) & 1) << 0xe | auVar83._14_2_ & 0x8000) != 0xffff
     ) {
    sVar84 = sVar101 * 2 + sVar66;
    sVar85 = uVar35 * 2 + uVar36;
    sVar86 = sVar76 * 2 + sVar81;
    sVar87 = uVar41 * 2 + uVar42;
    sVar58 = sVar100 + sVar100 + sVar99 + sVar99 + sVar93 + 4;
    sVar63 = uVar34 + uVar34 + uVar33 + uVar33 + uVar32 + 4;
    sVar64 = sVar75 + sVar75 + sVar74 + sVar74 + sVar69 + 4;
    sVar65 = uVar40 + uVar40 + uVar39 + uVar39 + uVar38 + 4;
    auVar77._0_2_ = sVar93 * 2 + sVar101 + sVar58;
    auVar77._2_2_ = uVar32 * 2 + uVar35 + sVar63;
    auVar77._4_2_ = sVar69 * 2 + sVar76 + sVar64;
    auVar77._6_2_ = uVar38 * 2 + uVar41 + sVar65;
    auVar77._8_2_ = sVar67 * 2 + sVar101 + sVar84 + sVar66 + sVar67 + 4;
    auVar77._10_2_ = uVar37 * 2 + uVar35 + sVar85 + uVar36 + uVar37 + 4;
    auVar77._12_2_ = sVar82 * 2 + sVar76 + sVar86 + sVar81 + sVar82 + 4;
    auVar77._14_2_ = uVar43 * 2 + uVar41 + sVar87 + uVar42 + uVar43 + 4;
    uVar133 = sVar84 + sVar58;
    uVar136 = sVar85 + sVar63;
    uVar137 = sVar86 + sVar64;
    uVar138 = sVar87 + sVar65;
    auVar108._0_2_ = uVar133 >> 3;
    auVar108._2_2_ = uVar136 >> 3;
    auVar108._4_2_ = uVar137 >> 3;
    auVar108._6_2_ = uVar138 >> 3;
    auVar108._8_2_ = auVar77._0_2_ >> 3;
    auVar108._10_2_ = auVar77._2_2_ >> 3;
    auVar108._12_2_ = auVar77._4_2_ >> 3;
    auVar108._14_2_ = auVar77._6_2_ >> 3;
    auVar62 = ~auVar89 & auVar119;
    uVar133 = ((sVar66 + sVar67) - (sVar99 + sVar93)) + uVar133;
    uVar136 = ((uVar36 + uVar37) - (uVar33 + uVar32)) + uVar136;
    uVar137 = ((sVar81 + sVar82) - (sVar74 + sVar69)) + uVar137;
    uVar138 = ((uVar42 + uVar43) - (uVar39 + uVar38)) + uVar138;
    auVar80._0_2_ = uVar133 >> 3;
    auVar80._2_2_ = uVar136 >> 3;
    auVar80._4_2_ = uVar137 >> 3;
    auVar80._6_2_ = uVar138 >> 3;
    auVar80._8_2_ = (ushort)((sVar67 * 2 - (sVar100 + sVar99)) + uVar133) >> 3;
    auVar80._10_2_ = (ushort)((uVar37 * 2 - (uVar34 + uVar33)) + uVar136) >> 3;
    auVar80._12_2_ = (ushort)((sVar82 * 2 - (sVar75 + sVar74)) + uVar137) >> 3;
    auVar80._14_2_ = (ushort)((uVar43 * 2 - (uVar40 + uVar39)) + uVar138) >> 3;
    auVar119 = auVar80 & auVar89 | auVar62;
    auVar92 = auVar108 & auVar89 | ~auVar89 & auVar92;
  }
  auVar56._4_4_ = auVar92._8_4_;
  auVar56._0_4_ = auVar92._0_4_;
  auVar56._8_4_ = auVar92._4_4_;
  auVar56._12_4_ = auVar92._12_4_;
  auVar104 = pshufhw(auVar62,auVar56,0x72);
  auVar72 = pshuflw(auVar56,auVar56,0x72);
  auVar73._4_4_ = auVar119._8_4_;
  auVar73._0_4_ = auVar119._0_4_;
  auVar73._8_4_ = auVar119._4_4_;
  auVar73._12_4_ = auVar119._12_4_;
  auVar92 = pshufhw(auVar77,auVar73,0xd8);
  auVar119 = pshuflw(auVar73,auVar73,0xd8);
  *(ulong *)(s + -2) = CONCAT44(auVar119._0_4_,auVar72._0_4_);
  *(ulong *)(s + (long)p + -2) = CONCAT44(auVar119._4_4_,auVar72._4_4_);
  *(ulong *)(s + (long)(p * 2) + -2) = CONCAT44(auVar92._8_4_,auVar104._8_4_);
  *(ulong *)(s + (long)(p * 3) + -2) = CONCAT44(auVar92._12_4_,auVar104._12_4_);
  return;
}

Assistant:

void aom_highbd_lpf_vertical_6_sse2(uint16_t *s, int p, const uint8_t *blimit,
                                    const uint8_t *limit, const uint8_t *thresh,
                                    int bd) {
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i x3, x2, x1, x0, p0, q0;
  __m128i p1p0, q1q0;

  x3 = _mm_loadu_si128((__m128i *)((s - 3) + 0 * p));
  x2 = _mm_loadu_si128((__m128i *)((s - 3) + 1 * p));
  x1 = _mm_loadu_si128((__m128i *)((s - 3) + 2 * p));
  x0 = _mm_loadu_si128((__m128i *)((s - 3) + 3 * p));

  highbd_transpose4x8_8x4_sse2(&x3, &x2, &x1, &x0, &d0, &d1, &d2, &d3, &d4, &d5,
                               &d6, &d7);

  highbd_lpf_internal_6_sse2(&d0, &d1, &d2, &d3, &d4, &d5, &p1p0, &q1q0, blimit,
                             limit, thresh, bd);

  p0 = _mm_srli_si128(p1p0, 8);
  q0 = _mm_srli_si128(q1q0, 8);

  highbd_transpose4x8_8x4_low_sse2(&p0, &p1p0, &q1q0, &q0, &d0, &d1, &d2, &d3);

  _mm_storel_epi64((__m128i *)(s - 2 + 0 * p), d0);
  _mm_storel_epi64((__m128i *)(s - 2 + 1 * p), d1);
  _mm_storel_epi64((__m128i *)(s - 2 + 2 * p), d2);
  _mm_storel_epi64((__m128i *)(s - 2 + 3 * p), d3);
}